

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O1

char * url_encode(char *s,size_t n)

{
  byte bVar1;
  size_t __size;
  ulong in_RAX;
  char *__dest;
  ulong uVar2;
  ulong uVar3;
  char *__src;
  bool bVar4;
  char ch [2];
  undefined8 uStack_38;
  
  __size = n * 2;
  uStack_38 = in_RAX;
  __dest = (char *)malloc(__size);
  if (__dest == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    *__dest = '\0';
    if (n != 0) {
      uVar2 = 0;
      uVar3 = 1;
      do {
        bVar1 = s[uVar2];
        if (bVar1 < 0x2d) {
          if (bVar1 == 10) {
            __src = "%0A";
          }
          else {
            __src = "%2B";
            if (bVar1 != 0x2b) {
LAB_0010b1cd:
              uStack_38 = (ulong)CONCAT16(bVar1,(undefined6)uStack_38);
              __src = (char *)((long)&uStack_38 + 6);
            }
          }
        }
        else if (bVar1 == 0x3d) {
          __src = "%3D";
        }
        else {
          if (bVar1 != 0x2d) goto LAB_0010b1cd;
          __src = "%2D";
        }
        strncat(__dest,__src,__size);
        bVar4 = uVar3 < n;
        uVar2 = uVar3;
        uVar3 = (ulong)((int)uVar3 + 1);
      } while (bVar4);
    }
    __dest[__size - 1] = '\0';
  }
  return __dest;
}

Assistant:

char * url_encode(char *s, size_t n) {
	char	*r;
	size_t	len;
	unsigned int     i;
	char    ch[2];

	/* Allocate 2 times bigger space than the original string */
	len = 2 * n;
	r = (char *)malloc(len);
	if (r == NULL) {
		return NULL;
	}
#ifdef WIN32
	strcpy_s(r, sizeof(r), "");
#else
	strcpy(r, "");
#endif

	/* Copy data */
	for (i = 0; i < n; i++) {
		switch (*(s+i)) {
			case '+':
#ifdef WIN32
				//strncat_s(r, sizeof(r), "%2B", len);
				strncat(r, "%2B", len);
#else
				strncat(r, "%2B", len);
#endif
				break;
			case '-':
#ifdef WIN32
				//strncat_s(r, sizeof(r), "%2D", len);
				strncat(r, "%2D", len);
#else
				strncat(r, "%2D", len);
#endif
				break;
			case '=':
#ifdef WIN32
				//strncat_s(r, sizeof(r), "%3D", len);
				strncat(r, "%3D", len);
#else
				strncat(r, "%3D", len);
#endif
				break;
			case '\n':
#ifdef WIN32
				//strncat_s(r, sizeof(r), "%0A", len);
				strncat(r, "%0A", len);
#else
				strncat(r, "%0A", len);
#endif
				break;
			default:
				ch[0] = *(s+i);
				ch[1] = '\0';
#ifdef WIN32
				//strncat_s(r, sizeof(r), ch, len);
				strncat(r, ch, len);
#else
				strncat(r, ch, len);
#endif
				break;
		}
	}
	r[len-1] = '\0';
	return r;
}